

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * sqlite3_errmsg(sqlite3 *db)

{
  u8 uVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  
  if (db == (sqlite3 *)0x0) {
    return "out of memory";
  }
  uVar1 = db->eOpenState;
  if (((uVar1 != 'm') && (uVar1 != 'v')) && (uVar1 != 0xba)) {
    sqlite3_log(0x15,"API call with %s database connection pointer","invalid");
    sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x2bb34,
                "0f80b798b3f4b81a7bb4233c58294edd0f1156f36b6ecf5ab8e83631d468778c");
    return "bad parameter or other API misuse";
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  if (db->mallocFailed != '\0') {
    pcVar4 = "out of memory";
    goto LAB_00127316;
  }
  if (db->errCode == 0) {
    uVar3 = 0;
LAB_001273da:
    if ((0x1410004UL >> (uVar3 & 0x3f) & 1) == 0) {
      pcVar4 = (&sqlite3ErrStr_aMsg)[uVar3];
      goto LAB_00127316;
    }
  }
  else {
    pcVar4 = (char *)sqlite3ValueText(db->pErr,'\x01');
    if (pcVar4 != (char *)0x0) goto LAB_00127316;
    uVar2 = db->errCode;
    if (uVar2 == 0x204) {
      pcVar4 = "abort due to ROLLBACK";
      goto LAB_00127316;
    }
    if (uVar2 == 0x65) {
      pcVar4 = "no more rows available";
      goto LAB_00127316;
    }
    if (uVar2 == 100) {
      pcVar4 = "another row available";
      goto LAB_00127316;
    }
    uVar3 = (ulong)(uVar2 & 0xff);
    if ((uVar2 & 0xff) < 0x1d) goto LAB_001273da;
  }
  pcVar4 = "unknown error";
LAB_00127316:
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return pcVar4;
}

Assistant:

SQLITE_API const char *sqlite3_errmsg(sqlite3 *db){
  const char *z;
  if( !db ){
    return sqlite3ErrStr(SQLITE_NOMEM_BKPT);
  }
  if( !sqlite3SafetyCheckSickOrOk(db) ){
    return sqlite3ErrStr(SQLITE_MISUSE_BKPT);
  }
  sqlite3_mutex_enter(db->mutex);
  if( db->mallocFailed ){
    z = sqlite3ErrStr(SQLITE_NOMEM_BKPT);
  }else{
    testcase( db->pErr==0 );
    z = db->errCode ? (char*)sqlite3_value_text(db->pErr) : 0;
    assert( !db->mallocFailed );
    if( z==0 ){
      z = sqlite3ErrStr(db->errCode);
    }
  }
  sqlite3_mutex_leave(db->mutex);
  return z;
}